

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_set_register_tests.cpp
# Opt level: O3

void __thiscall
bidfx_public_api::price::pixie::SubjectSetRegisterTest_test_comparator_with_realistic_subjects_Test
::TestBody(SubjectSetRegisterTest_test_comparator_with_realistic_subjects_Test *this)

{
  pointer pSVar1;
  bool bVar2;
  vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
  *rhs;
  char *message;
  uint uVar3;
  ulong uVar4;
  pointer pSVar5;
  AssertionResult gtest_ar;
  vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
  shuffle_input;
  default_random_engine rng;
  Subject subject;
  SubjectSetRegister subject_register;
  internal local_188 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_180;
  vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
  local_178;
  ulong local_160;
  AssertHelper local_158;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> local_150;
  Subject local_148 [24];
  _Storage<bidfx_public_api::price::pixie::SubscriptionSync,_false> local_130;
  SubjectSetRegister local_c0 [48];
  _Rb_tree<bidfx_public_api::price::subject::Subject,_std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState>,_std::_Select1st<std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState>_>,_std::less<bidfx_public_api::price::subject::Subject>,_std::allocator<std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState>_>_>
  local_90 [48];
  _Rb_tree<int,_std::pair<const_int,_std::shared_ptr<bidfx_public_api::price::pixie::EditionData>_>,_std::_Select1st<std::pair<const_int,_std::shared_ptr<bidfx_public_api::price::pixie::EditionData>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<bidfx_public_api::price::pixie::EditionData>_>_>_>
  local_60 [48];
  
  std::
  vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
  ::vector(&local_178,
           (vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
            *)RealSubscriptionExample::REAL_SORTED_LIST);
  local_150._M_x = 1;
  uVar4 = 0;
  do {
    bidfx_public_api::price::pixie::SubjectSetRegister::SubjectSetRegister(local_c0);
    local_160 = uVar4;
    std::
    shuffle<__gnu_cxx::__normal_iterator<bidfx_public_api::price::subject::Subject*,std::vector<bidfx_public_api::price::subject::Subject,std::allocator<bidfx_public_api::price::subject::Subject>>>,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
              ((__normal_iterator<bidfx_public_api::price::subject::Subject_*,_std::vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>_>
                )local_178.
                 super__Vector_base<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
                 ._M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<bidfx_public_api::price::subject::Subject_*,_std::vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>_>
                )local_178.
                 super__Vector_base<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
                 ._M_impl.super__Vector_impl_data._M_finish,&local_150);
    pSVar1 = local_178.
             super__Vector_base<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pSVar5 = local_178.
                  super__Vector_base<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
                  ._M_impl.super__Vector_impl_data._M_start; pSVar5 != pSVar1;
        pSVar5 = pSVar5 + 0x18) {
      bidfx_public_api::price::subject::Subject::Subject((Subject *)&local_130._M_value,pSVar5);
      bidfx_public_api::price::subject::Subject::Subject(local_148,(Subject *)&local_130._M_value);
      bidfx_public_api::price::pixie::SubjectSetRegister::Register(local_c0,local_148,0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_148);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_130._M_value);
    }
    bidfx_public_api::price::pixie::SubjectSetRegister::NextSubscriptionSync();
    rhs = (vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
           *)bidfx_public_api::price::pixie::SubscriptionSync::GetSubjects();
    uVar4 = local_160;
    testing::internal::
    CmpHelperEQ<std::vector<bidfx_public_api::price::subject::Subject,std::allocator<bidfx_public_api::price::subject::Subject>>,std::vector<bidfx_public_api::price::subject::Subject,std::allocator<bidfx_public_api::price::subject::Subject>>>
              (local_188,"RealSubscriptionExample::REAL_SORTED_LIST",
               "subject_register.NextSubscriptionSync()->GetSubjects()",
               (vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
                *)RealSubscriptionExample::REAL_SORTED_LIST,rhs);
    std::_Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync>::_M_reset
              ((_Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync> *)
               &local_130._M_value);
    if (local_188[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_130._M_value);
      message = "";
      if (local_180.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
         ) {
        message = ((local_180.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_158,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/subject_set_register_tests.cpp"
                 ,0x1de,message);
      testing::internal::AssertHelper::operator=(&local_158,(Message *)&local_130._M_value);
      testing::internal::AssertHelper::~AssertHelper(&local_158);
      if ((long *)local_130._0_8_ != (long *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) && ((long *)local_130._0_8_ != (long *)0x0)) {
          (**(code **)(*(long *)local_130._0_8_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_180,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    std::
    _Rb_tree<int,_std::pair<const_int,_std::shared_ptr<bidfx_public_api::price::pixie::EditionData>_>,_std::_Select1st<std::pair<const_int,_std::shared_ptr<bidfx_public_api::price::pixie::EditionData>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<bidfx_public_api::price::pixie::EditionData>_>_>_>
    ::~_Rb_tree(local_60);
    std::
    _Rb_tree<bidfx_public_api::price::subject::Subject,_std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState>,_std::_Select1st<std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState>_>,_std::less<bidfx_public_api::price::subject::Subject>,_std::allocator<std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState>_>_>
    ::~_Rb_tree(local_90);
    uVar3 = (int)uVar4 + 1;
    uVar4 = (ulong)uVar3;
  } while (uVar3 != 100);
  std::
  vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
  ::~vector(&local_178);
  return;
}

Assistant:

TEST(SubjectSetRegisterTest, test_comparator_with_realistic_subjects)
{
    std::vector<Subject> shuffle_input(RealSubscriptionExample::REAL_SORTED_LIST);
    auto rng = std::default_random_engine {};

    for (int i = 0; i < 100; i++)
    {
        SubjectSetRegister subject_register = SubjectSetRegister();
        std::shuffle(std::begin(shuffle_input), std::end(shuffle_input), rng);

        for (Subject subject : shuffle_input)
        {
            subject_register.Register(std::move(subject), false);
        }

        EXPECT_EQ(RealSubscriptionExample::REAL_SORTED_LIST, subject_register.NextSubscriptionSync()->GetSubjects());
    }
}